

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O0

int Aig_ManCountXors(Aig_Man_t *p)

{
  int iVar1;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_30 = 0;
  pObj = (Aig_Obj_t *)p;
  for (local_2c = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)&pObj->TravId), local_2c < iVar1;
      local_2c = local_2c + 1) {
    pFan0 = (Aig_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)&pObj->TravId,local_2c);
    if ((((pFan0 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pFan0), iVar1 != 0)) &&
        (iVar1 = Aig_ObjIsMuxType(pFan0), iVar1 != 0)) &&
       (iVar1 = Aig_ObjRecognizeExor(pFan0,&pFan1,(Aig_Obj_t **)&Counter), iVar1 != 0)) {
      local_30 = local_30 + 1;
    }
  }
  return local_30;
}

Assistant:

int Aig_ManCountXors( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFan0, * pFan1;
    int i, Counter = 0;
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjIsMuxType(pObj) && Aig_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            Counter++;
    return Counter;

}